

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmExgDxDy<(moira::Instr)63,(moira::Mode)12,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Dn dst;
  Dn src;
  Dn local_24;
  Dn local_20;
  ushort local_1a;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_10 = in_RSI;
  Dn::Dn(&local_20,(int)(uint)in_CX >> 9 & 7);
  Dn::Dn(&local_24,local_1a & 7);
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<(pSVar1,local_20);
  pSVar1 = StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,local_24);
  return;
}

Assistant:

void
Moira::dasmExgDxDy(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn ( ____xxx_________(op) );
    auto dst = Dn ( _____________xxx(op) );

    str << Ins<I>{} << tab << src << ", " << dst;
}